

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsort.c
# Opt level: O1

saidx64_t sort_typeBstar(sauchar_t *T,saidx64_t *SA,saidx64_t *bucket_A,saidx64_t *bucket_B,
                        saidx64_t n)

{
  long lVar1;
  ulong uVar2;
  byte bVar3;
  byte bVar4;
  ulong uVar5;
  long *plVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ushort uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  saidx64_t *psVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  long *plVar22;
  int iVar23;
  bool bVar24;
  
  memset(bucket_A,0,0x800);
  memset(bucket_B,0,0x80000);
  uVar2 = n - 1;
  uVar11 = n;
  if (0 < n) {
    uVar8 = (ulong)T[uVar2];
    uVar10 = uVar2;
LAB_00101488:
    do {
      uVar15 = uVar10;
      bucket_A[uVar8] = bucket_A[uVar8] + 1;
      uVar12 = (uint)uVar8;
      if (0 < (long)uVar15) {
        uVar8 = (ulong)T[uVar15 - 1];
        uVar10 = uVar15 - 1;
        if (uVar12 <= T[uVar15 - 1]) goto LAB_00101488;
      }
      uVar5 = 0xffffffffffffffff;
      uVar10 = uVar5;
      if (0 < (long)uVar15) {
        bucket_B[(int)uVar8 << 8 | uVar12] = bucket_B[(int)uVar8 << 8 | uVar12] + 1;
        SA[uVar11 - 1] = uVar15 - 1;
        uVar11 = uVar11 - 1;
        if (uVar15 != 1) {
          uVar9 = uVar8;
          uVar15 = uVar15 - 2;
          do {
            bVar3 = T[uVar15];
            uVar8 = (ulong)bVar3;
            uVar10 = uVar15;
            if ((uint)uVar9 < (uint)bVar3) break;
            bucket_B[(uint)uVar9 << 8 | (uint)bVar3] = bucket_B[(uint)uVar9 << 8 | (uint)bVar3] + 1;
            bVar24 = 0 < (long)uVar15;
            uVar10 = uVar5;
            uVar9 = uVar8;
            uVar15 = uVar15 - 1;
          } while (bVar24);
        }
      }
    } while (-1 < (long)uVar10);
  }
  plVar6 = bucket_B + 0x100;
  uVar10 = 0;
  lVar20 = 0;
  lVar18 = 0;
  psVar17 = bucket_B;
  do {
    lVar21 = bucket_A[uVar10];
    bucket_A[uVar10] = lVar20 + lVar18;
    lVar20 = lVar21 + lVar20 + bucket_B[(uint)((int)uVar10 << 8) | uVar10];
    if (uVar10 < 0xff) {
      lVar21 = 1;
      plVar22 = plVar6;
      do {
        lVar18 = lVar18 + psVar17[lVar21];
        psVar17[lVar21] = lVar18;
        lVar20 = lVar20 + *plVar22;
        plVar22 = plVar22 + 0x100;
        lVar1 = uVar10 + lVar21;
        lVar21 = lVar21 + 1;
      } while (lVar1 != 0xff);
    }
    uVar10 = uVar10 + 1;
    plVar6 = plVar6 + 0x101;
    psVar17 = psVar17 + 0x101;
  } while (uVar10 != 0x100);
  lVar18 = n - uVar11;
  if (lVar18 != 0 && (long)uVar11 <= n) {
    if (lVar18 != 1) {
      lVar20 = ~uVar11 + n;
      plVar6 = SA + n + -2;
      do {
        uVar13 = *(ushort *)(T + *plVar6) << 8 | *(ushort *)(T + *plVar6) >> 8;
        lVar20 = lVar20 + -1;
        lVar21 = bucket_B[uVar13];
        bucket_B[uVar13] = lVar21 + -1;
        SA[lVar21 + -1] = lVar20;
        plVar6 = plVar6 + -1;
      } while (0 < lVar20);
    }
    psVar17 = SA + lVar18;
    lVar20 = lVar18 + -1;
    uVar13 = *(ushort *)(T + SA[n + -1]) << 8 | *(ushort *)(T + SA[n + -1]) >> 8;
    lVar21 = bucket_B[uVar13];
    bucket_B[uVar13] = lVar21 + -1;
    SA[lVar21 + -1] = lVar20;
    iVar23 = 0xfe;
    lVar21 = lVar18;
    do {
      uVar12 = 0xff;
      lVar1 = lVar21;
      do {
        lVar21 = bucket_B[(int)(uVar12 | iVar23 << 8)];
        if (1 < lVar1 - lVar21) {
          sssort64(T,SA + (n - lVar18),SA + lVar21,SA + lVar1,psVar17,n + lVar18 * -2,2,n,
                   (uint)(SA[lVar21] == lVar20));
        }
        uVar12 = uVar12 - 1;
        lVar1 = lVar21;
      } while (iVar23 < (int)uVar12);
      iVar23 = iVar23 + -1;
      lVar1 = lVar20;
    } while (0 < lVar21);
    do {
      if (-1 < SA[lVar1]) {
        lVar21 = -1;
        do {
          lVar16 = lVar21;
          lVar7 = lVar1;
          psVar17[SA[lVar7]] = lVar7;
          if (lVar7 < 1) break;
          lVar1 = lVar7 + -1;
          lVar21 = lVar16 + -1;
        } while (-1 < SA[lVar7 + -1]);
        SA[lVar7] = lVar16;
        if (lVar7 < 2) break;
        lVar1 = lVar7 + -1;
      }
      lVar21 = lVar1 + -1;
      do {
        lVar7 = lVar21;
        uVar11 = SA[lVar7 + 1];
        SA[lVar7 + 1] = ~uVar11;
        psVar17[~uVar11] = lVar1;
        lVar21 = lVar7 + -1;
      } while (SA[lVar7] < 0);
      psVar17[SA[lVar7]] = lVar1;
      lVar1 = lVar7 + -1;
    } while (1 < lVar7 + 1);
    trsort64(psVar17,SA,lVar18,1);
    if (0 < n) {
      bVar3 = T[uVar2];
      lVar21 = lVar18;
      do {
        uVar11 = (long)uVar2 >> 0x3f & uVar2;
        bVar4 = bVar3;
        do {
          uVar15 = uVar2;
          uVar8 = uVar11;
          uVar10 = uVar11 - 1;
          bVar3 = bVar4;
          if ((long)uVar15 < 1) break;
          uVar10 = uVar15 - 1;
          bVar3 = T[uVar15 - 1];
          bVar24 = bVar4 <= bVar3;
          uVar8 = uVar15;
          uVar2 = uVar10;
          bVar4 = bVar3;
        } while (bVar24);
        if ((long)uVar15 < 1) {
          uVar2 = 0xffffffffffffffff;
        }
        else {
          uVar11 = uVar8 - 2;
          uVar2 = uVar11;
          if (uVar8 != 1) {
            uVar15 = uVar11;
            bVar4 = bVar3;
            do {
              bVar3 = T[uVar15];
              uVar2 = uVar15;
              if (bVar4 < bVar3) break;
              bVar24 = 0 < (long)uVar15;
              uVar2 = ((long)uVar11 >> 0x3f & uVar11) - 1;
              uVar15 = uVar15 - 1;
              bVar4 = bVar3;
            } while (bVar24);
          }
          uVar11 = -uVar8;
          if (1 < (long)(uVar10 - uVar2)) {
            uVar11 = uVar10;
          }
          if (uVar10 == 0) {
            uVar11 = uVar10;
          }
          lVar1 = lVar21 + -1;
          lVar21 = lVar21 + -1;
          SA[psVar17[lVar1]] = uVar11;
        }
      } while (-1 < (long)uVar2);
    }
    bucket_B[0xffff] = n;
    uVar2 = 0xfe;
    do {
      uVar12 = (uint)uVar2;
      uVar11 = 0xff;
      lVar21 = bucket_A[uVar2 + 1] + -1;
      lVar1 = lVar20;
      do {
        uVar14 = (uint)uVar11;
        uVar19 = uVar14 << 8 | uVar12;
        lVar7 = lVar21 - bucket_B[(int)uVar19];
        bucket_B[(int)uVar19] = lVar21;
        lVar21 = bucket_B[(int)(uVar14 | uVar12 << 8)];
        lVar20 = lVar1;
        if (lVar21 <= lVar1) {
          do {
            SA[lVar7] = SA[lVar1];
            lVar7 = lVar7 + -1;
            lVar20 = lVar1 + -1;
            bVar24 = lVar21 < lVar1;
            lVar1 = lVar20;
          } while (bVar24);
        }
        uVar11 = (ulong)(uVar14 - 1);
        lVar21 = lVar7;
        lVar1 = lVar20;
      } while (uVar2 < uVar11);
      uVar14 = uVar12 << 8 | uVar12;
      bucket_B[(int)(uVar12 << 8 | uVar12 + 1)] = (lVar7 - bucket_B[(int)uVar14]) + 1;
      bucket_B[(int)uVar14] = lVar7;
      bVar24 = uVar2 != 0;
      uVar2 = uVar2 - 1;
    } while (bVar24);
  }
  return lVar18;
}

Assistant:

static
saidx_t
sort_typeBstar(const sauchar_t *T, saidx_t *SA,
               saidx_t *bucket_A, saidx_t *bucket_B,
               saidx_t n) {
  saidx_t *PAb, *ISAb, *buf;
#ifdef _OPENMP
  saidx_t *curbuf;
  saidx_t l;
#endif
  saidx_t i, j, k, t, m, bufsize;
  saint_t c0, c1;
#ifdef _OPENMP
  saint_t d0, d1;
  int tmp;
#endif

  /* Initialize bucket arrays. */
  for(i = 0; i < BUCKET_A_SIZE; ++i) { bucket_A[i] = 0; }
  for(i = 0; i < BUCKET_B_SIZE; ++i) { bucket_B[i] = 0; }

  /* Count the number of occurrences of the first one or two characters of each
     type A, B and B* suffix. Moreover, store the beginning position of all
     type B* suffixes into the array SA. */
  for(i = n - 1, m = n, c0 = T[n - 1]; 0 <= i;) {
    /* type A suffix. */
    do { ++BUCKET_A(c1 = c0); } while((0 <= --i) && ((c0 = T[i]) >= c1));
    if(0 <= i) {
      /* type B* suffix. */
      ++BUCKET_BSTAR(c0, c1);
      SA[--m] = i;
      /* type B suffix. */
      for(--i, c1 = c0; (0 <= i) && ((c0 = T[i]) <= c1); --i, c1 = c0) {
        ++BUCKET_B(c0, c1);
      }
    }
  }
  m = n - m;
/*
note:
  A type B* suffix is lexicographically smaller than a type B suffix that
  begins with the same first two characters.
*/

  /* Calculate the index of start/end point of each bucket. */
  for(c0 = 0, i = 0, j = 0; c0 < ALPHABET_SIZE; ++c0) {
    t = i + BUCKET_A(c0);
    BUCKET_A(c0) = i + j; /* start point */
    i = t + BUCKET_B(c0, c0);
    for(c1 = c0 + 1; c1 < ALPHABET_SIZE; ++c1) {
      j += BUCKET_BSTAR(c0, c1);
      BUCKET_BSTAR(c0, c1) = j; /* end point */
      i += BUCKET_B(c0, c1);
    }
  }

  if(0 < m) {
    /* Sort the type B* suffixes by their first two characters. */
    PAb = SA + n - m; ISAb = SA + m;
    for(i = m - 2; 0 <= i; --i) {
      t = PAb[i], c0 = T[t], c1 = T[t + 1];
      SA[--BUCKET_BSTAR(c0, c1)] = i;
    }
    t = PAb[m - 1], c0 = T[t], c1 = T[t + 1];
    SA[--BUCKET_BSTAR(c0, c1)] = m - 1;

    /* Sort the type B* substrings using sssort. */
#ifdef _OPENMP
    tmp = omp_get_max_threads();
    buf = SA + m, bufsize = (n - (2 * m)) / tmp;
    c0 = ALPHABET_SIZE - 2, c1 = ALPHABET_SIZE - 1, j = m;
#pragma omp parallel default(shared) private(curbuf, k, l, d0, d1, tmp)
    {
      tmp = omp_get_thread_num();
      curbuf = buf + tmp * bufsize;
      k = 0;
      for(;;) {
        #pragma omp critical(sssort_lock)
        {
          if(0 < (l = j)) {
            d0 = c0, d1 = c1;
            do {
              k = BUCKET_BSTAR(d0, d1);
              if(--d1 <= d0) {
                d1 = ALPHABET_SIZE - 1;
                if(--d0 < 0) { break; }
              }
            } while(((l - k) <= 1) && (0 < (l = k)));
            c0 = d0, c1 = d1, j = k;
          }
        }
        if(l == 0) { break; }
        sssort(T, PAb, SA + k, SA + l,
               curbuf, bufsize, 2, n, *(SA + k) == (m - 1));
      }
    }
#else
    buf = SA + m, bufsize = n - (2 * m);
    for(c0 = ALPHABET_SIZE - 2, j = m; 0 < j; --c0) {
      for(c1 = ALPHABET_SIZE - 1; c0 < c1; j = i, --c1) {
        i = BUCKET_BSTAR(c0, c1);
        if(1 < (j - i)) {
          sssort(T, PAb, SA + i, SA + j,
                 buf, bufsize, 2, n, *(SA + i) == (m - 1));
        }
      }
    }
#endif

    /* Compute ranks of type B* substrings. */
    for(i = m - 1; 0 <= i; --i) {
      if(0 <= SA[i]) {
        j = i;
        do { ISAb[SA[i]] = i; } while((0 <= --i) && (0 <= SA[i]));
        SA[i + 1] = i - j;
        if(i <= 0) { break; }
      }
      j = i;
      do { ISAb[SA[i] = ~SA[i]] = j; } while(SA[--i] < 0);
      ISAb[SA[i]] = j;
    }

    /* Construct the inverse suffix array of type B* suffixes using trsort. */
    trsort(ISAb, SA, m, 1);

    /* Set the sorted order of tyoe B* suffixes. */
    for(i = n - 1, j = m, c0 = T[n - 1]; 0 <= i;) {
      for(--i, c1 = c0; (0 <= i) && ((c0 = T[i]) >= c1); --i, c1 = c0) { }
      if(0 <= i) {
        t = i;
        for(--i, c1 = c0; (0 <= i) && ((c0 = T[i]) <= c1); --i, c1 = c0) { }
        SA[ISAb[--j]] = ((t == 0) || (1 < (t - i))) ? t : ~t;
      }
    }

    /* Calculate the index of start/end point of each bucket. */
    BUCKET_B(ALPHABET_SIZE - 1, ALPHABET_SIZE - 1) = n; /* end point */
    for(c0 = ALPHABET_SIZE - 2, k = m - 1; 0 <= c0; --c0) {
      i = BUCKET_A(c0 + 1) - 1;
      for(c1 = ALPHABET_SIZE - 1; c0 < c1; --c1) {
        t = i - BUCKET_B(c0, c1);
        BUCKET_B(c0, c1) = i; /* end point */

        /* Move all type B* suffixes to the correct position. */
        for(i = t, j = BUCKET_BSTAR(c0, c1);
            j <= k;
            --i, --k) { SA[i] = SA[k]; }
      }
      BUCKET_BSTAR(c0, c0 + 1) = i - BUCKET_B(c0, c0) + 1; /* start point */
      BUCKET_B(c0, c0) = i; /* end point */
    }
  }

  return m;
}